

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::symbol_codec::clear(symbol_codec *this)

{
  uchar *puVar1;
  output_symbol *p;
  
  this->m_bit_buf = 0;
  this->m_bit_count = 0;
  this->m_total_model_updates = 0;
  this->m_mode = cNull;
  this->m_simulate_encoding = false;
  this->m_total_bits_written = 0;
  this->m_pDecode_buf = (uint8 *)0x0;
  this->m_pDecode_buf_next = (uint8 *)0x0;
  this->m_pDecode_buf_end = (uint8 *)0x0;
  this->m_decode_buf_size = 0;
  this->m_arith_base = 0;
  this->m_arith_value = 0;
  this->m_arith_length = 0;
  this->m_arith_total_bits = 0;
  puVar1 = (this->m_output_buf).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
    (this->m_output_buf).m_p = (uchar *)0x0;
    (this->m_output_buf).m_size = 0;
    (this->m_output_buf).m_capacity = 0;
  }
  puVar1 = (this->m_arith_output_buf).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
    (this->m_arith_output_buf).m_p = (uchar *)0x0;
    (this->m_arith_output_buf).m_size = 0;
    (this->m_arith_output_buf).m_capacity = 0;
  }
  p = (this->m_output_syms).m_p;
  if (p != (output_symbol *)0x0) {
    crnlib_free(p);
    (this->m_output_syms).m_p = (output_symbol *)0x0;
    (this->m_output_syms).m_size = 0;
    (this->m_output_syms).m_capacity = 0;
  }
  return;
}

Assistant:

void symbol_codec::clear()
    {
        m_pDecode_buf = nullptr;
        m_pDecode_buf_next = nullptr;
        m_pDecode_buf_end = nullptr;
        m_decode_buf_size = 0;

        m_bit_buf = 0;
        m_bit_count = 0;
        m_total_model_updates = 0;
        m_mode = cNull;
        m_simulate_encoding = false;
        m_total_bits_written = 0;

        m_arith_base = 0;
        m_arith_value = 0;
        m_arith_length = 0;
        m_arith_total_bits = 0;

        m_output_buf.clear();
        m_arith_output_buf.clear();
        m_output_syms.clear();
    }